

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this)

{
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_RDI;
  
  ~basic_memory_buffer(in_RDI);
  operator_delete(in_RDI,0x120);
  return;
}

Assistant:

~basic_memory_buffer() FMT_OVERRIDE { deallocate(); }